

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_RoundTrip.c
# Opt level: O0

WJTL_STATUS TestParseJson1AndOutput(void)

{
  JL_STATUS JVar1;
  int iVar2;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  char inputJson [282];
  size_t errorPos;
  char *outputJson;
  JlDataObject *objectTree;
  WJTL_STATUS TestReturn;
  
  objectTree._0_4_ = WJTL_STATUS_SUCCESS;
  outputJson = (char *)0x0;
  errorPos = 0;
  stack0xffffffffffffffd8 = 0;
  memcpy(&_result_7,
         "{ \"Key1\": \"Value1\", \"Key2\" : \"Value2\", \"Key3\":[1,2,3 ,4 , 5  ,6,7],\n  \"Key4\" : { \"SubKey1\" : true, \"SubKey2\":false, \"SubKey3\":null }, \n  \"Key5\":{ \"a\":1000, \"b\":2000.5, \"c\":-3000, \"d\":-4e123 },\n  \"Key6\":{ \"a\":[\"aa\",\"bb\",true,false,1,2,3,4,-5,null,\"\",{\"a\":0}], \"b\":{\"c\":1,\"d\":2} } }\n"
         ,0x11a);
  JVar1 = JlParseJsonEx(&_result_7,false,(JlDataObject **)&outputJson,(size_t *)(inputJson + 0x118))
  ;
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( inputJson, 0, &objectTree, &errorPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestParseJson1AndOutput",0x3f);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._0_4_ = WJTL_STATUS_FAILED;
  }
  if (outputJson == (char *)0x0) {
    objectTree._4_4_ = (WJTL_STATUS)objectTree;
  }
  else {
    JVar1 = JlOutputJson((JlDataObject *)outputJson,false,(char **)&errorPos);
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlOutputJson( objectTree, 0, &outputJson ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                     ,"TestParseJson1AndOutput",0x43);
    if (JVar1 != JL_STATUS_SUCCESS) {
      objectTree._0_4_ = WJTL_STATUS_FAILED;
    }
    iVar2 = strcmp((char *)errorPos,
                   "{\"Key1\":\"Value1\",\"Key2\":\"Value2\",\"Key3\":[1,2,3,4,5,6,7],\"Key4\":{\"SubKey1\":true,\"SubKey2\":false,\"SubKey3\":null},\"Key5\":{\"a\":1000,\"b\":2000.5,\"c\":-3000,\"d\":-4e+123},\"Key6\":{\"a\":[\"aa\",\"bb\",true,false,1,2,3,4,-5,null,null,{\"a\":0}],\"b\":{\"c\":1,\"d\":2}}}"
                  );
    WjTestLib_Assert(iVar2 == 0,
                     "strcmp( outputJson, \"{\\\"Key1\\\":\\\"Value1\\\",\\\"Key2\\\":\\\"Value2\\\",\\\"Key3\\\":[1,2,3,4,5,6,7],\" \"\\\"Key4\\\":{\\\"SubKey1\\\":true,\\\"SubKey2\\\":false,\\\"SubKey3\\\":null},\" \"\\\"Key5\\\":{\\\"a\\\":1000,\\\"b\\\":2000.5,\\\"c\\\":-3000,\\\"d\\\":-4e+123},\" \"\\\"Key6\\\":{\\\"a\\\":[\\\"aa\\\",\\\"bb\\\",true,false,1,2,3,4,-5,null,null,{\\\"a\\\":0}],\\\"b\\\":{\\\"c\\\":1,\\\"d\\\":2}}}\" ) == 0"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                     ,"TestParseJson1AndOutput",0x48);
    if (iVar2 != 0) {
      objectTree._0_4_ = WJTL_STATUS_FAILED;
    }
    JVar1 = JlFreeObjectTree((JlDataObject **)&outputJson);
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                     ,"TestParseJson1AndOutput",0x4a);
    if (JVar1 != JL_STATUS_SUCCESS) {
      objectTree._0_4_ = WJTL_STATUS_FAILED;
    }
    JVar1 = JlFreeJsonStringBuffer((char **)&errorPos);
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeJsonStringBuffer( &outputJson ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                     ,"TestParseJson1AndOutput",0x4b);
    if (JVar1 != JL_STATUS_SUCCESS) {
      objectTree._0_4_ = WJTL_STATUS_FAILED;
    }
    JVar1 = JlParseJsonEx(&_result_7,true,(JlDataObject **)&outputJson,(size_t *)(inputJson + 0x118)
                         );
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlParseJsonEx( inputJson, 1, &objectTree, &errorPos ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                     ,"TestParseJson1AndOutput",0x4e);
    if (JVar1 != JL_STATUS_SUCCESS) {
      objectTree._0_4_ = WJTL_STATUS_FAILED;
    }
    if (outputJson == (char *)0x0) {
      objectTree._4_4_ = (WJTL_STATUS)objectTree;
    }
    else {
      JVar1 = JlOutputJson((JlDataObject *)outputJson,false,(char **)&errorPos);
      WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlOutputJson( objectTree, 0, &outputJson ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x52);
      if (JVar1 != JL_STATUS_SUCCESS) {
        objectTree._0_4_ = WJTL_STATUS_FAILED;
      }
      iVar2 = strcmp((char *)errorPos,
                     "{\"Key1\":\"Value1\",\"Key2\":\"Value2\",\"Key3\":[1,2,3,4,5,6,7],\"Key4\":{\"SubKey1\":true,\"SubKey2\":false,\"SubKey3\":null},\"Key5\":{\"a\":1000,\"b\":2000.5,\"c\":-3000,\"d\":-4e+123},\"Key6\":{\"a\":[\"aa\",\"bb\",true,false,1,2,3,4,-5,null,null,{\"a\":0}],\"b\":{\"c\":1,\"d\":2}}}"
                    );
      WjTestLib_Assert(iVar2 == 0,
                       "strcmp( outputJson, \"{\\\"Key1\\\":\\\"Value1\\\",\\\"Key2\\\":\\\"Value2\\\",\\\"Key3\\\":[1,2,3,4,5,6,7],\" \"\\\"Key4\\\":{\\\"SubKey1\\\":true,\\\"SubKey2\\\":false,\\\"SubKey3\\\":null},\" \"\\\"Key5\\\":{\\\"a\\\":1000,\\\"b\\\":2000.5,\\\"c\\\":-3000,\\\"d\\\":-4e+123},\" \"\\\"Key6\\\":{\\\"a\\\":[\\\"aa\\\",\\\"bb\\\",true,false,1,2,3,4,-5,null,null,{\\\"a\\\":0}],\\\"b\\\":{\\\"c\\\":1,\\\"d\\\":2}}}\" ) == 0"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x57);
      if (iVar2 != 0) {
        objectTree._0_4_ = WJTL_STATUS_FAILED;
      }
      JVar1 = JlFreeJsonStringBuffer((char **)&errorPos);
      WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlFreeJsonStringBuffer( &outputJson ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x59);
      if (JVar1 != JL_STATUS_SUCCESS) {
        objectTree._0_4_ = WJTL_STATUS_FAILED;
      }
      JVar1 = JlOutputJson((JlDataObject *)outputJson,true,(char **)&errorPos);
      WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlOutputJson( objectTree, 1, &outputJson ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x5c);
      if (JVar1 != JL_STATUS_SUCCESS) {
        objectTree._0_4_ = WJTL_STATUS_FAILED;
      }
      iVar2 = strcmp((char *)errorPos,
                     "{\n    \"Key1\": \"Value1\",\n    \"Key2\": \"Value2\",\n    \"Key3\": [\n        1,\n        2,\n        3,\n        4,\n        5,\n        6,\n        7\n    ],\n    \"Key4\": {\n        \"SubKey1\": true,\n        \"SubKey2\": false,\n        \"SubKey3\": null\n    },\n    \"Key5\": {\n        \"a\": 1000,\n        \"b\": 2000.5,\n        \"c\": -3000,\n        \"d\": -4e+123\n    },\n    \"Key6\": {\n        \"a\": [\n            \"aa\",\n            \"bb\",\n            true,\n            false,\n            1,\n            2,\n            3,\n            4,\n            -5,\n            null,\n            null,\n            {\n                \"a\": 0\n            }\n        ],\n        \"b\": {\n            \"c\": 1,\n            \"d\": 2\n        }\n    }\n}\n"
                    );
      WjTestLib_Assert(iVar2 == 0,
                       "strcmp( outputJson, \"{\\n\" \"    \\\"Key1\\\": \\\"Value1\\\",\\n\" \"    \\\"Key2\\\": \\\"Value2\\\",\\n\" \"    \\\"Key3\\\": [\\n\" \"        1,\\n\" \"        2,\\n\" \"        3,\\n\" \"        4,\\n\" \"        5,\\n\" \"        6,\\n\" \"        7\\n\" \"    ],\\n\" \"    \\\"Key4\\\": {\\n\" \"        \\\"SubKey1\\\": true,\\n\" \"        \\\"SubKey2\\\": false,\\n\" \"        \\\"SubKey3\\\": null\\n\" \"    },\\n\" \"    \\\"Key5\\\": {\\n\" \"        \\\"a\\\": 1000,\\n\" \"        \\\"b\\\": 2000.5,\\n\" \"        \\\"c\\\": -3000,\\n\" \"        \\\"d\\\": -4e+123\\n\" \"    },\\n\" \"    \\\"Key6\\\": {\\n\" \"        \\\"a\\\": [\\n\" \"            \\\"aa\\\",\\n\" \"            \\\"bb\\\",\\n\" \"            true,\\n\" \"            false,\\n\" \"            1,\\n\" \"            2,\\n\" \"            3,\\n\" \"            4,\\n\" \"            -5,\\n\" \"            null,\\n\" \"            null,\\n\" \"            {\\n\" \"                \\\"a\\\": 0\\n\" \"            }\\n\" \"        ],\\n\" \"        \\\"b\\\": {\\n\" \"            \\\"c\\\": 1,\\n\" \"            \\\"d\\\": 2\\n\" \"        }\\n\" \"    }\\n\" \"}\\n\" ) == 0"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x8b);
      if (iVar2 != 0) {
        objectTree._0_4_ = WJTL_STATUS_FAILED;
      }
      JVar1 = JlFreeObjectTree((JlDataObject **)&outputJson);
      WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x8d);
      if (JVar1 != JL_STATUS_SUCCESS) {
        objectTree._0_4_ = WJTL_STATUS_FAILED;
      }
      JVar1 = JlFreeJsonStringBuffer((char **)&errorPos);
      WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlFreeJsonStringBuffer( &outputJson ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x8e);
      if (JVar1 != JL_STATUS_SUCCESS) {
        objectTree._0_4_ = WJTL_STATUS_FAILED;
      }
      objectTree._4_4_ = (WJTL_STATUS)objectTree;
    }
  }
  return objectTree._4_4_;
}

Assistant:

static
WJTL_STATUS
    TestParseJson1AndOutput
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    JlDataObject* objectTree = NULL;
    char* outputJson = NULL;
    size_t errorPos = 0;

    const char inputJson[] =
        "{ \"Key1\": \"Value1\", \"Key2\" : \"Value2\", \"Key3\":[1,2,3 ,4 , 5  ,6,7],\n"
        "  \"Key4\" : { \"SubKey1\" : true, \"SubKey2\":false, \"SubKey3\":null }, \n"
        "  \"Key5\":{ \"a\":1000, \"b\":2000.5, \"c\":-3000, \"d\":-4e123 },\n"
        "  \"Key6\":{ \"a\":[\"aa\",\"bb\",true,false,1,2,3,4,-5,null,\"\",{\"a\":0}], \"b\":{\"c\":1,\"d\":2} } }\n";

    // Parse as Json1
    JL_ASSERT_SUCCESS( JlParseJsonEx( inputJson, false, &objectTree, &errorPos ) );
    if( NULL == objectTree ) { return TestReturn; }

    // Output as Json1, no formatting
    JL_ASSERT_SUCCESS( JlOutputJson( objectTree, false, &outputJson ) );
    JL_ASSERT( strcmp( outputJson,
        "{\"Key1\":\"Value1\",\"Key2\":\"Value2\",\"Key3\":[1,2,3,4,5,6,7],"
        "\"Key4\":{\"SubKey1\":true,\"SubKey2\":false,\"SubKey3\":null},"
        "\"Key5\":{\"a\":1000,\"b\":2000.5,\"c\":-3000,\"d\":-4e+123},"
        "\"Key6\":{\"a\":[\"aa\",\"bb\",true,false,1,2,3,4,-5,null,null,{\"a\":0}],\"b\":{\"c\":1,\"d\":2}}}" ) == 0 );

    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );
    JL_ASSERT_SUCCESS( JlFreeJsonStringBuffer( &outputJson ) );

    // Parse as Json5
    JL_ASSERT_SUCCESS( JlParseJsonEx( inputJson, true, &objectTree, &errorPos ) );
    if( NULL == objectTree ) { return TestReturn; }

    // Output as Json1, no formatting
    JL_ASSERT_SUCCESS( JlOutputJson( objectTree, false, &outputJson ) );
    JL_ASSERT( strcmp( outputJson,
        "{\"Key1\":\"Value1\",\"Key2\":\"Value2\",\"Key3\":[1,2,3,4,5,6,7],"
        "\"Key4\":{\"SubKey1\":true,\"SubKey2\":false,\"SubKey3\":null},"
        "\"Key5\":{\"a\":1000,\"b\":2000.5,\"c\":-3000,\"d\":-4e+123},"
        "\"Key6\":{\"a\":[\"aa\",\"bb\",true,false,1,2,3,4,-5,null,null,{\"a\":0}],\"b\":{\"c\":1,\"d\":2}}}" ) == 0 );

    JL_ASSERT_SUCCESS( JlFreeJsonStringBuffer( &outputJson ) );

    // Output as Json1, with indenting formatting
    JL_ASSERT_SUCCESS( JlOutputJson( objectTree, true, &outputJson ) );
    JL_ASSERT( strcmp( outputJson,
        "{\n"
        "    \"Key1\": \"Value1\",\n"
        "    \"Key2\": \"Value2\",\n"
        "    \"Key3\": [\n"
        "        1,\n"
        "        2,\n"
        "        3,\n"
        "        4,\n"
        "        5,\n"
        "        6,\n"
        "        7\n"
        "    ],\n"
        "    \"Key4\": {\n"
        "        \"SubKey1\": true,\n"
        "        \"SubKey2\": false,\n"
        "        \"SubKey3\": null\n"
        "    },\n"
        "    \"Key5\": {\n"
        "        \"a\": 1000,\n"
        "        \"b\": 2000.5,\n"
        "        \"c\": -3000,\n"
        "        \"d\": -4e+123\n"
        "    },\n"
        "    \"Key6\": {\n"
        "        \"a\": [\n"
        "            \"aa\",\n"
        "            \"bb\",\n"
        "            true,\n"
        "            false,\n"
        "            1,\n"
        "            2,\n"
        "            3,\n"
        "            4,\n"
        "            -5,\n"
        "            null,\n"
        "            null,\n"
        "            {\n"
        "                \"a\": 0\n"
        "            }\n"
        "        ],\n"
        "        \"b\": {\n"
        "            \"c\": 1,\n"
        "            \"d\": 2\n"
        "        }\n"
        "    }\n"
        "}\n" ) == 0 );

    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );
    JL_ASSERT_SUCCESS( JlFreeJsonStringBuffer( &outputJson ) );

    return TestReturn;
}